

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

int prvTidyEncodeCharToUTF8Bytes(uint c,tmbstr encodebuf,TidyOutputSink *outp,int *count)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  byte tempbuf [10];
  byte local_40 [16];
  
  local_40[8] = 0;
  local_40[9] = 0;
  local_40[0] = 0;
  local_40[1] = 0;
  local_40[2] = 0;
  local_40[3] = 0;
  local_40[4] = 0;
  local_40[5] = 0;
  local_40[6] = 0;
  local_40[7] = 0;
  pbVar2 = (byte *)encodebuf;
  if (encodebuf == (tmbstr)0x0) {
    pbVar2 = local_40;
  }
  bVar5 = (byte)c;
  if (c < 0x80) {
    *pbVar2 = bVar5;
    bVar10 = true;
    lVar9 = 1;
LAB_00137519:
    if (bVar10 == true && outp != (TidyOutputSink *)0x0) {
      lVar4 = 0;
      do {
        (*outp->putByte)(outp->sinkData,pbVar2[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar9 != lVar4);
    }
    *count = (int)lVar9;
    return bVar10 - 1;
  }
  if (c < 0x800) {
    pbVar1 = local_40;
    if (encodebuf != (tmbstr)0x0) {
      pbVar1 = (byte *)encodebuf;
    }
    *pbVar2 = (byte)(c >> 6) | 0xc0;
    pbVar1[1] = bVar5 & 0x3f | 0x80;
    bVar10 = true;
    lVar9 = 2;
    goto LAB_00137519;
  }
  if (c < 0x10000) {
    *pbVar2 = (byte)(c >> 0xc) | 0xe0;
    pbVar1 = local_40;
    if (encodebuf != (tmbstr)0x0) {
      pbVar1 = (byte *)encodebuf;
    }
    pbVar1[1] = (byte)(c >> 6) & 0x3f | 0x80;
    pbVar1[2] = bVar5 & 0x3f | 0x80;
    bVar10 = (~c & 0xfffe) != 0;
    lVar9 = 3;
    goto LAB_00137519;
  }
  if (c < 0x200000) {
    *pbVar2 = (byte)(c >> 0x12) | 0xf0;
    pbVar1 = local_40;
    if (encodebuf != (tmbstr)0x0) {
      pbVar1 = (byte *)encodebuf;
    }
    pbVar1[1] = (byte)(c >> 0xc) & 0x3f | 0x80;
    pbVar1[2] = (byte)(c >> 6) & 0x3f | 0x80;
    pbVar1[3] = bVar5 & 0x3f | 0x80;
    bVar10 = c < 0x110000;
    lVar9 = 4;
    goto LAB_00137519;
  }
  bVar6 = (byte)(c >> 0x18);
  if (c < 0x4000000) {
    *pbVar2 = bVar6 | 0xf8;
    bVar6 = (byte)(c >> 0x12);
    iVar3 = 5;
    lVar9 = 4;
    lVar4 = 3;
    lVar7 = 2;
    lVar8 = 1;
  }
  else {
    if ((int)c < 0) {
      iVar3 = 0;
      goto LAB_00137628;
    }
    *pbVar2 = bVar6 >> 6 | 0xfc;
    pbVar2 = (byte *)encodebuf;
    if (encodebuf == (tmbstr)0x0) {
      pbVar2 = local_40;
    }
    pbVar2[1] = bVar6 & 0x3f | 0x80;
    bVar6 = (byte)(c >> 0x12) & 0x3f;
    iVar3 = 6;
    lVar9 = 5;
    lVar4 = 4;
    lVar7 = 3;
    lVar8 = 2;
  }
  pbVar2 = local_40;
  if (encodebuf != (tmbstr)0x0) {
    pbVar2 = (byte *)encodebuf;
  }
  pbVar2[lVar8] = bVar6 | 0x80;
  pbVar2[lVar7] = (byte)(c >> 0xc) & 0x3f | 0x80;
  pbVar2[lVar4] = (byte)(c >> 6) & 0x3f | 0x80;
  pbVar2[lVar9] = bVar5 & 0x3f | 0x80;
LAB_00137628:
  *count = iVar3;
  return -1;
}

Assistant:

int TY_(EncodeCharToUTF8Bytes)( uint c, tmbstr encodebuf,
                                TidyOutputSink* outp, int* count )
{
    byte tempbuf[10] = {0};
    byte* buf = &tempbuf[0];
    int bytes = 0;
    Bool hasError = no;
    
    if ( encodebuf )
        buf = (byte*) encodebuf;
        
    if (c <= 0x7F)  /* 0XXX XXXX one byte */
    {
        buf[0] = (tmbchar) c;
        bytes = 1;
    }
    else if (c <= 0x7FF)  /* 110X XXXX  two bytes */
    {
        buf[0] = (tmbchar) ( 0xC0 | (c >> 6) );
        buf[1] = (tmbchar) ( 0x80 | (c & 0x3F) );
        bytes = 2;
    }
    else if (c <= 0xFFFF)  /* 1110 XXXX  three bytes */
    {
        buf[0] = (tmbchar) (0xE0 | (c >> 12));
        buf[1] = (tmbchar) (0x80 | ((c >> 6) & 0x3F));
        buf[2] = (tmbchar) (0x80 | (c & 0x3F));
        bytes = 3;
        if ( c == kUTF8ByteSwapNotAChar || c == kUTF8NotAChar )
            hasError = yes;
    }
    else if (c <= 0x1FFFFF)  /* 1111 0XXX  four bytes */
    {
        buf[0] = (tmbchar) (0xF0 | (c >> 18));
        buf[1] = (tmbchar) (0x80 | ((c >> 12) & 0x3F));
        buf[2] = (tmbchar) (0x80 | ((c >> 6) & 0x3F));
        buf[3] = (tmbchar) (0x80 | (c & 0x3F));
        bytes = 4;
        if (c > kMaxUTF8FromUCS4)
            hasError = yes;
    }
    else if (c <= 0x3FFFFFF)  /* 1111 10XX  five bytes */
    {
        buf[0] = (tmbchar) (0xF8 | (c >> 24));
        buf[1] = (tmbchar) (0x80 | (c >> 18));
        buf[2] = (tmbchar) (0x80 | ((c >> 12) & 0x3F));
        buf[3] = (tmbchar) (0x80 | ((c >> 6) & 0x3F));
        buf[4] = (tmbchar) (0x80 | (c & 0x3F));
        bytes = 5;
        hasError = yes;
    }
    else if (c <= 0x7FFFFFFF)  /* 1111 110X  six bytes */
    {
        buf[0] = (tmbchar) (0xFC | (c >> 30));
        buf[1] = (tmbchar) (0x80 | ((c >> 24) & 0x3F));
        buf[2] = (tmbchar) (0x80 | ((c >> 18) & 0x3F));
        buf[3] = (tmbchar) (0x80 | ((c >> 12) & 0x3F));
        buf[4] = (tmbchar) (0x80 | ((c >> 6) & 0x3F));
        buf[5] = (tmbchar) (0x80 | (c & 0x3F));
        bytes = 6;
        hasError = yes;
    }
    else
        hasError = yes;
        
    /* don't output invalid UTF-8 byte sequence to a stream */
    if ( !hasError && outp != NULL )
    {
        int ix;
        for ( ix=0; ix < bytes; ++ix )
          outp->putByte( outp->sinkData, buf[ix] );
    }

#if 1 && defined(_DEBUG)
    if ( hasError )
    {
        int i;
        fprintf( stderr, "UTF-8 encoding error for U+%x : ", c );
        for (i = 0; i < bytes; i++)
            fprintf( stderr, "0x%02x ", buf[i] );
        fprintf( stderr, "\n" );
    }
#endif
    
    *count = bytes;
    if (hasError)
        return -1;
    return 0;
}